

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O0

string * __thiscall
cmLinkLineDeviceComputer::ComputeLinkLibraries
          (string *__return_storage_ptr__,cmLinkLineDeviceComputer *this,
          cmComputeLinkInformation *cli,string *stdLibString)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  ItemVector *this_00;
  ulong uVar5;
  ostream *poVar6;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  bool local_34a;
  string local_2e8;
  string local_2c8;
  undefined1 local_2a8 [8];
  string out;
  string local_280;
  allocator<char> local_259;
  string local_258;
  byte local_231;
  reference pIStack_230;
  bool skip;
  Item *item;
  const_iterator __end1;
  const_iterator __begin1;
  ItemVector *__range1;
  undefined1 local_208 [7];
  bool skipItemAfterFramework;
  string config;
  ItemVector *items;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  ostringstream fout;
  string *stdLibString_local;
  cmComputeLinkInformation *cli_local;
  cmLinkLineDeviceComputer *this_local;
  
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&items);
  this_00 = cmComputeLinkInformation::GetItems(cli);
  cmComputeLinkInformation::GetConfig_abi_cxx11_((string *)local_208,cli);
  bVar2 = false;
  __end1 = std::
           vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
           begin(this_00);
  item = (Item *)std::
                 vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                 ::end(this_00);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                                *)&item);
    if (!bVar3) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        poVar6 = std::operator<<((ostream *)
                                 &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 (string *)stdLibString);
        std::operator<<(poVar6," ");
      }
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::~string((string *)local_208);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&items);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return __return_storage_ptr__;
    }
    pIStack_230 = __gnu_cxx::
                  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                  ::operator*(&__end1);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      if (pIStack_230->Target != (cmGeneratorTarget *)0x0) {
        local_231 = 1;
        TVar4 = cmGeneratorTarget::GetType(pIStack_230->Target);
        if (TVar4 == STATIC_LIBRARY) {
          pcVar1 = pIStack_230->Target;
          std::allocator<char>::allocator();
          out.field_2._M_local_buf[0xe] = '\0';
          out.field_2._M_local_buf[0xd] = '\0';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_258,"CUDA_RESOLVE_DEVICE_SYMBOLS",&local_259);
          bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_258);
          local_34a = false;
          if (!bVar3) {
            pcVar1 = pIStack_230->Target;
            std::allocator<char>::allocator();
            out.field_2._M_local_buf[0xe] = '\x01';
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_280,"CUDA_SEPARABLE_COMPILATION",
                       (allocator<char> *)(out.field_2._M_local_buf + 0xf));
            out.field_2._M_local_buf[0xd] = '\x01';
            local_34a = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_280);
          }
          if ((out.field_2._M_local_buf[0xd] & 1U) != 0) {
            std::__cxx11::string::~string((string *)&local_280);
          }
          if ((out.field_2._M_local_buf[0xe] & 1U) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)(out.field_2._M_local_buf + 0xf));
          }
          std::__cxx11::string::~string((string *)&local_258);
          std::allocator<char>::~allocator(&local_259);
          if (local_34a != false) {
            local_231 = 0;
          }
        }
        if ((local_231 & 1) != 0) goto LAB_005ed976;
      }
      std::__cxx11::string::string((string *)local_2a8);
      if ((pIStack_230->IsPath & 1U) == 0) {
        bVar3 = std::operator==(&pIStack_230->Value,"-framework");
        if (!bVar3) {
          bVar3 = cmLinkItemValidForDevice(&pIStack_230->Value);
          if (bVar3) {
            std::__cxx11::string::operator+=((string *)local_2a8,(string *)pIStack_230);
          }
          goto LAB_005ed8be;
        }
        bVar2 = true;
      }
      else {
        bVar3 = cmHasLiteralSuffix<std::__cxx11::string,3ul>
                          (&pIStack_230->Value,(char (*) [3])0x953981);
        if ((bVar3) ||
           (bVar3 = cmHasLiteralSuffix<std::__cxx11::string,5ul>
                              (&pIStack_230->Value,(char (*) [5])".lib"), bVar3)) {
          (*(this->super_cmLinkLineComputer)._vptr_cmLinkLineComputer[2])
                    (&local_2e8,this,pIStack_230);
          cmLinkLineComputer::ConvertToOutputFormat
                    (&local_2c8,&this->super_cmLinkLineComputer,&local_2e8);
          std::__cxx11::string::operator+=((string *)local_2a8,(string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_2e8);
        }
LAB_005ed8be:
        pVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&items,(value_type *)local_2a8);
        if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          poVar6 = std::operator<<((ostream *)
                                   &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   (string *)local_2a8);
          std::operator<<(poVar6," ");
        }
      }
      std::__cxx11::string::~string((string *)local_2a8);
    }
LAB_005ed976:
    __gnu_cxx::
    __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::string cmLinkLineDeviceComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString)
{
  // Write the library flags to the build rule.
  std::ostringstream fout;

  // Generate the unique set of link items when device linking.
  // The nvcc device linker is designed so that each static library
  // with device symbols only needs to be listed once as it doesn't
  // care about link order.
  std::set<std::string> emitted;
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  bool skipItemAfterFramework = false;
  for (auto const& item : items) {
    if (skipItemAfterFramework) {
      skipItemAfterFramework = false;
      continue;
    }

    if (item.Target) {
      bool skip = true;
      if (item.Target->GetType() == cmStateEnums::STATIC_LIBRARY) {
        if ((!item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS")) &&
            item.Target->GetPropertyAsBool("CUDA_SEPARABLE_COMPILATION")) {
          skip = false;
        }
      }
      if (skip) {
        continue;
      }
    }

    std::string out;
    if (item.IsPath) {
      // nvcc understands absolute paths to libraries ending in '.a' or '.lib'.
      // These should be passed to nvlink.  Other extensions need to be left
      // out because nvlink may not understand or need them.  Even though it
      // can tolerate '.so' or '.dylib' it cannot tolerate '.so.1'.
      if (cmHasLiteralSuffix(item.Value, ".a") ||
          cmHasLiteralSuffix(item.Value, ".lib")) {
        out += this->ConvertToOutputFormat(
          this->ConvertToLinkReference(item.Value));
      }
    } else if (item.Value == "-framework") {
      // This is the first part of '-framework Name' where the framework
      // name is specified as a following item.  Ignore both.
      skipItemAfterFramework = true;
      continue;
    } else if (cmLinkItemValidForDevice(item.Value)) {
      out += item.Value;
    }

    if (emitted.insert(out).second) {
      fout << out << " ";
    }
  }

  if (!stdLibString.empty()) {
    fout << stdLibString << " ";
  }

  return fout.str();
}